

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCStress.cpp
# Opt level: O0

void SwapObjects(void)

{
  RecyclerTestObject *value;
  RecyclerTestObject *value_00;
  Location LVar1;
  RecyclerTestObject *object;
  undefined1 local_38 [8];
  Location location2;
  undefined1 local_18 [8];
  Location location1;
  
  LVar1 = GetRandomLocation();
  location2._8_8_ = LVar1.location;
  location1.location._0_4_ = LVar1.type;
  local_18 = (undefined1  [8])location2._8_8_;
  LVar1 = GetRandomLocation();
  local_38 = (undefined1  [8])LVar1.location;
  location2.location._0_4_ = LVar1.type;
  value = Location::Get((Location *)local_18);
  value_00 = Location::Get((Location *)local_38);
  Location::Set((Location *)local_18,value_00);
  Location::Set((Location *)local_38,value);
  return;
}

Assistant:

void SwapObjects()
{
    // Walk to two random locations in the current object graph
    Location location1 = GetRandomLocation();
    Location location2 = GetRandomLocation();

    // Swap their references.
    RecyclerTestObject * object = location1.Get();
    location1.Set(location2.Get());
    location2.Set(object);
}